

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O2

void __thiscall icu_63::CurrencyPluralInfo::~CurrencyPluralInfo(CurrencyPluralInfo *this)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CurrencyPluralInfo_0039f088;
  deleteHash(this,this->fPluralCountToCurrencyUnitPattern);
  this->fPluralCountToCurrencyUnitPattern = (Hashtable *)0x0;
  if (this->fPluralRules != (PluralRules *)0x0) {
    (*(this->fPluralRules->super_UObject)._vptr_UObject[1])();
  }
  if (this->fLocale != (Locale *)0x0) {
    (*(this->fLocale->super_UObject)._vptr_UObject[1])();
  }
  this->fPluralRules = (PluralRules *)0x0;
  this->fLocale = (Locale *)0x0;
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

CurrencyPluralInfo::~CurrencyPluralInfo() {
    deleteHash(fPluralCountToCurrencyUnitPattern);
    fPluralCountToCurrencyUnitPattern = nullptr;
    delete fPluralRules;
    delete fLocale;
    fPluralRules = nullptr;
    fLocale = nullptr;
}